

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pdu.cc
# Opt level: O0

void __thiscall assembler::SessionPDU::SessionPDU(SessionPDU *this,int vcid,int apid)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x135220);
  *(undefined8 *)(in_RDI + 8) = 0;
  in_RDI[10] = 0;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x13523c)
  ;
  std::unique_ptr<SZ_com_t_s,std::default_delete<SZ_com_t_s>>::
  unique_ptr<std::default_delete<SZ_com_t_s>,void>
            ((unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_> *)CONCAT44(in_ESI,in_EDX));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13525c);
  in_RDI[0x2a] = 0;
  return;
}

Assistant:

SessionPDU::SessionPDU(int vcid, int apid)
  : vcid(vcid),
    apid(apid),
    remainingHeaderBytes_(0),
    lastSequenceCount_(0),
    linesDone_(0) {
}